

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O1

bool __thiscall Assimp::TriangulateProcess::TriangulateMesh(TriangulateProcess *this,aiMesh *pMesh)

{
  uint **ppuVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  aiFace *paVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  aiFace *paVar13;
  void *pvVar14;
  uint *puVar15;
  float *pfVar16;
  Logger *this_00;
  uint uVar17;
  aiFace *paVar18;
  ulong uVar19;
  int iVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  aiVector3D *paVar27;
  long lVar28;
  aiFace *f;
  aiFace *paVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  uint temp [4];
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> temp_verts;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp_verts3d;
  int local_fc;
  uint local_a8 [6];
  uint *local_90;
  float local_84;
  aiFace *local_80;
  ulong local_78;
  aiVector3D *local_70;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_68;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_50;
  char *local_38;
  
  uVar17 = pMesh->mPrimitiveTypes;
  if (uVar17 == 0) {
    if ((ulong)pMesh->mNumFaces != 0) {
      lVar28 = 0;
      bVar32 = false;
      do {
        if (*(int *)((long)&pMesh->mFaces->mNumIndices + lVar28) != 3) {
          bVar32 = true;
        }
        lVar28 = lVar28 + 0x10;
      } while ((ulong)pMesh->mNumFaces << 4 != lVar28);
      if (bVar32) goto LAB_003e255c;
    }
  }
  else if ((uVar17 & 8) != 0) {
LAB_003e255c:
    uVar24 = pMesh->mNumFaces;
    if ((ulong)uVar24 == 0) {
      uVar11 = 0;
      uVar30 = 0;
    }
    else {
      lVar28 = 0;
      uVar30 = 0;
      uVar11 = 0;
      do {
        uVar4 = *(uint *)((long)&pMesh->mFaces->mNumIndices + lVar28);
        if (uVar4 < 4) {
          uVar30 = uVar30 + 1;
          uVar4 = uVar11;
        }
        else {
          uVar30 = (uVar30 + uVar4) - 2;
          if (uVar4 < uVar11) {
            uVar4 = uVar11;
          }
        }
        uVar11 = uVar4;
        lVar28 = lVar28 + 0x10;
      } while ((ulong)uVar24 << 4 != lVar28);
    }
    if (uVar30 == uVar24) {
      __assert_fail("numOut != pMesh->mNumFaces",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/TriangulateProcess.cpp"
                    ,0xa2,"bool Assimp::TriangulateProcess::TriangulateMesh(aiMesh *)");
    }
    pMesh->mPrimitiveTypes = uVar17 & 0xfffffff3 | 4;
    uVar23 = (ulong)uVar30;
    puVar12 = (ulong *)operator_new__(uVar23 * 0x10 + 8);
    *puVar12 = uVar23;
    paVar18 = (aiFace *)(puVar12 + 1);
    if (uVar30 != 0) {
      paVar13 = paVar18;
      do {
        paVar13->mNumIndices = 0;
        paVar13->mIndices = (uint *)0x0;
        paVar13 = paVar13 + 1;
      } while (paVar13 != paVar18 + uVar23);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              (&local_50,(ulong)(uVar11 + 2),(allocator_type *)&local_68);
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
              (&local_68,(ulong)(uVar11 + 2),(allocator_type *)local_a8);
    local_70 = pMesh->mVertices;
    pvVar14 = operator_new__((ulong)uVar11);
    local_80 = paVar18;
    if (pMesh->mNumFaces != 0) {
      local_38 = (char *)((long)pvVar14 + 2);
      uVar23 = 0;
      do {
        paVar13 = pMesh->mFaces;
        uVar17 = paVar13[uVar23].mNumIndices;
        uVar31 = (ulong)(int)uVar17;
        if (uVar31 < 4) {
          paVar18->mNumIndices = uVar17;
          paVar18->mIndices = paVar13[uVar23].mIndices;
          paVar13[uVar23].mIndices = (uint *)0x0;
          paVar18 = paVar18 + 1;
        }
        else {
          local_78 = uVar23;
          if (uVar17 == 4) {
            uVar26 = 0;
            uVar31 = 0;
            do {
              uVar19 = uVar31;
              if (uVar19 == 4) goto LAB_003e2a13;
              puVar15 = paVar13[uVar23].mIndices;
              uVar17 = puVar15[(int)uVar19 - 1U & 3];
              uVar24 = puVar15[uVar19 ^ 2];
              uVar11 = puVar15[(uint)(uVar19 + 1) & 3];
              uVar30 = puVar15[uVar19];
              fVar36 = local_70[uVar30].x;
              fVar37 = local_70[uVar30].y;
              fVar38 = local_70[uVar17].x - fVar36;
              fVar44 = local_70[uVar17].y - fVar37;
              fVar42 = local_70[uVar30].z;
              local_84 = local_70[uVar17].z - fVar42;
              fVar43 = local_70[uVar24].x;
              fVar33 = local_70[uVar24].y;
              fVar40 = local_70[uVar24].z;
              fVar39 = local_70[uVar11].x;
              fVar35 = local_70[uVar11].y;
              fVar41 = local_70[uVar11].z;
              local_90 = (uint *)CONCAT44(local_90._4_4_,fVar44);
              fVar44 = local_84 * local_84 + fVar38 * fVar38 + fVar44 * fVar44;
              if (fVar44 < 0.0) {
                fVar44 = sqrtf(fVar44);
              }
              else {
                fVar44 = SQRT(fVar44);
              }
              fVar43 = fVar43 - fVar36;
              fVar33 = fVar33 - fVar37;
              fVar40 = fVar40 - fVar42;
              fVar34 = fVar40 * fVar40 + fVar43 * fVar43 + fVar33 * fVar33;
              if (fVar34 < 0.0) {
                fVar34 = sqrtf(fVar34);
              }
              else {
                fVar34 = SQRT(fVar34);
              }
              fVar39 = fVar39 - fVar36;
              fVar35 = fVar35 - fVar37;
              fVar41 = fVar41 - fVar42;
              fVar36 = fVar41 * fVar41 + fVar39 * fVar39 + fVar35 * fVar35;
              if (fVar36 < 0.0) {
                fVar36 = sqrtf(fVar36);
              }
              else {
                fVar36 = SQRT(fVar36);
              }
              fVar44 = 1.0 / fVar44;
              fVar34 = 1.0 / fVar34;
              fVar36 = 1.0 / fVar36;
              fVar37 = acosf(local_84 * fVar44 * fVar40 * fVar34 +
                             fVar38 * fVar44 * fVar43 * fVar34 +
                             local_90._0_4_ * fVar44 * fVar33 * fVar34);
              fVar36 = acosf(fVar41 * fVar36 * fVar40 * fVar34 +
                             fVar39 * fVar36 * fVar43 * fVar34 + fVar35 * fVar36 * fVar33 * fVar34);
              uVar31 = uVar19 + 1;
            } while (fVar36 + fVar37 <= 3.1415927);
            uVar26 = uVar19 & 0xffffffff;
LAB_003e2a13:
            puVar15 = paVar13[uVar23].mIndices;
            local_a8[0] = *puVar15;
            local_a8[1] = puVar15[1];
            local_a8[2] = puVar15[2];
            local_a8[3] = puVar15[3];
            paVar18->mNumIndices = 3;
            puVar15 = paVar13[uVar23].mIndices;
            paVar18->mIndices = puVar15;
            uVar17 = (uint)uVar26;
            *puVar15 = local_a8[uVar26];
            paVar18->mIndices[1] = local_a8[uVar17 + 1 & 3];
            uVar24 = uVar17 & 3 ^ 2;
            paVar18->mIndices[2] = local_a8[uVar24];
            paVar18[1].mNumIndices = 3;
            puVar15 = (uint *)operator_new__(0xc);
            paVar18[1].mIndices = puVar15;
            *puVar15 = local_a8[uVar26];
            paVar18[1].mIndices[1] = local_a8[uVar24];
            paVar18[1].mIndices[2] = local_a8[uVar17 - 1 & 3];
            paVar13[uVar23].mIndices = (uint *)0x0;
            uVar23 = local_78;
            paVar18 = paVar18 + 2;
          }
          else {
            local_90 = paVar13[uVar23].mIndices;
            uVar26 = (ulong)uVar17;
            if (0 < (int)uVar17) {
              lVar28 = 0;
              puVar15 = local_90;
              do {
                uVar24 = *puVar15;
                *(float *)((long)&(local_50.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->z + lVar28) =
                     local_70[uVar24].z;
                *(undefined8 *)
                 ((long)&(local_50.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar28) =
                     *(undefined8 *)(local_70 + uVar24);
                puVar15 = puVar15 + 1;
                lVar28 = lVar28 + 0xc;
              } while (uVar26 * 0xc != lVar28);
            }
            local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar31].x =
                 (local_50.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x;
            iVar20 = uVar17 * 3 + 3;
            (&(local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->x)[iVar20] =
                 local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].x;
            local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar31].y =
                 (local_50.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->y;
            (&(local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->y)[iVar20] =
                 local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].y;
            local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar31].z =
                 (local_50.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->z;
            (&(local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->z)[iVar20] =
                 local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].z;
            if ((int)uVar17 < 1) {
              fVar37 = 0.0;
              fVar42 = 0.0;
              fVar36 = 0.0;
            }
            else {
              pfVar16 = &local_50.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[2].z;
              fVar36 = 0.0;
              fVar42 = 0.0;
              fVar37 = 0.0;
              uVar24 = uVar17;
              do {
                fVar37 = fVar37 + (pfVar16[-1] - pfVar16[-7]) * pfVar16[-5];
                fVar42 = fVar42 + (*pfVar16 - pfVar16[-6]) * pfVar16[-4];
                fVar36 = fVar36 + (((aiVector3t<float> *)(pfVar16 + -2))->x - pfVar16[-8]) *
                                  pfVar16[-3];
                pfVar16 = pfVar16 + 3;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
            }
            fVar43 = fVar42;
            if (fVar42 <= -fVar42) {
              fVar43 = -fVar42;
            }
            fVar33 = fVar36;
            if (fVar36 <= -fVar36) {
              fVar33 = -fVar36;
            }
            fVar40 = fVar37;
            if (fVar37 <= -fVar37) {
              fVar40 = -fVar37;
            }
            if (fVar43 <= fVar33) {
              if (fVar33 <= fVar40) goto LAB_003e2c27;
              iVar10 = 0;
              iVar20 = 2;
            }
            else if (fVar43 <= fVar40) {
LAB_003e2c27:
              iVar10 = 1;
              iVar20 = 0;
              fVar36 = fVar37;
            }
            else {
              iVar10 = 2;
              iVar20 = 1;
              fVar36 = fVar42;
            }
            iVar6 = iVar10;
            if (fVar36 < 0.0) {
              iVar6 = iVar20;
              iVar20 = iVar10;
            }
            if (0 < (int)uVar17) {
              uVar31 = 0;
              do {
                paVar27 = local_70 + local_90[uVar31];
                if (iVar20 == 2) {
                  paVar27 = (aiVector3D *)&paVar27->z;
                }
                else if (iVar20 == 1) {
                  paVar27 = (aiVector3D *)&paVar27->y;
                }
                local_68.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar31].x = paVar27->x;
                paVar27 = local_70 + local_90[uVar31];
                if (iVar6 == 2) {
                  paVar27 = (aiVector3D *)&paVar27->z;
                }
                else if (iVar6 == 1) {
                  paVar27 = (aiVector3D *)&paVar27->y;
                }
                local_68.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar31].y = paVar27->x;
                *(undefined1 *)((long)pvVar14 + uVar31) = 0;
                uVar31 = uVar31 + 1;
              } while (uVar26 != uVar31);
            }
            uVar24 = uVar17 - 1;
            uVar30 = 0;
            paVar29 = paVar18;
            uVar11 = uVar17;
            do {
              if ((int)uVar11 < 4) break;
              local_fc = 0;
              uVar4 = uVar30;
              uVar9 = uVar24;
              do {
                do {
                  do {
                    uVar24 = uVar9;
                    uVar25 = uVar4;
                    uVar30 = uVar30 + 1;
                    if ((int)uVar17 <= (int)uVar30) {
                      uVar30 = 0;
                    }
                    lVar28 = (long)(int)uVar30;
                    uVar4 = uVar25;
                    uVar9 = uVar24;
                  } while (*(char *)((long)pvVar14 + lVar28) != '\0');
                  if (((int)uVar30 < (int)uVar25) && (bVar32 = local_fc == 1, local_fc = 1, bVar32))
                  {
                    local_fc = 2;
                    goto LAB_003e2f8d;
                  }
                  fVar36 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar24].x;
                  fVar37 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar24].y;
                  fVar42 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar28].x;
                  fVar43 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar28].y;
                  fVar33 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar25].x;
                  fVar40 = local_68.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)uVar25].y;
                  uVar4 = uVar30;
                  uVar9 = uVar25;
                } while (0.0 < (fVar42 * (fVar40 - fVar37) +
                               (fVar37 - fVar43) * fVar33 + (fVar43 - fVar40) * fVar36) * 0.5);
                if ((int)uVar17 < 1) {
                  uVar31 = 0;
                }
                else {
                  fVar35 = fVar33 - fVar36;
                  fVar41 = fVar40 - fVar37;
                  fVar44 = fVar42 - fVar36;
                  fVar38 = fVar43 - fVar37;
                  fVar34 = fVar35 * fVar35 + fVar41 * fVar41;
                  fVar46 = fVar35 * fVar44 + fVar41 * fVar38;
                  fVar47 = fVar44 * fVar44 + fVar38 * fVar38;
                  fVar39 = 1.0 / (fVar34 * fVar47 - fVar46 * fVar46);
                  uVar19 = 0;
                  do {
                    fVar2 = local_68.
                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar19].x;
                    fVar48 = local_68.
                             super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19].y;
                    if ((fVar2 != fVar33) || (NAN(fVar2) || NAN(fVar33))) {
LAB_003e2e9f:
                      if ((fVar2 == fVar42) && (!NAN(fVar2) && !NAN(fVar42))) {
                        if ((fVar48 == fVar43) && (!NAN(fVar48) && !NAN(fVar43))) goto LAB_003e2f64;
                      }
                      if ((fVar2 == fVar36) && (!NAN(fVar2) && !NAN(fVar36))) {
                        if ((fVar48 == fVar37) && (!NAN(fVar48) && !NAN(fVar37))) goto LAB_003e2f64;
                      }
                      fVar45 = fVar35 * (fVar2 - fVar36) + fVar41 * (fVar48 - fVar37);
                      fVar48 = (fVar2 - fVar36) * fVar44 + (fVar48 - fVar37) * fVar38;
                      fVar2 = (fVar47 * fVar45 + -fVar46 * fVar48) * fVar39;
                      if (((0.0 < fVar2) &&
                          (fVar48 = (fVar48 * fVar34 + fVar45 * -fVar46) * fVar39, 0.0 < fVar48)) &&
                         (uVar31 = uVar19, fVar2 + fVar48 < 1.0)) break;
                    }
                    else if ((fVar48 != fVar40) || (NAN(fVar48) || NAN(fVar40))) goto LAB_003e2e9f;
LAB_003e2f64:
                    uVar19 = uVar19 + 1;
                    uVar31 = uVar26;
                  } while (uVar26 != uVar19);
                }
              } while ((uint)uVar31 != uVar17);
LAB_003e2f8d:
              if (local_fc == 2) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,
                              "Failed to triangulate polygon (no ear found). Probably not a simple polygon?"
                             );
                uVar11 = 0;
              }
              else {
                paVar29->mNumIndices = 3;
                if (paVar29->mIndices == (uint *)0x0) {
                  puVar15 = (uint *)operator_new__(0xc);
                  paVar29->mIndices = puVar15;
                }
                *paVar29->mIndices = uVar24;
                paVar29->mIndices[1] = uVar25;
                ppuVar1 = &paVar29->mIndices;
                paVar29 = paVar29 + 1;
                (*ppuVar1)[2] = uVar30;
                *(undefined1 *)((long)pvVar14 + (long)(int)uVar25) = 1;
                uVar11 = uVar11 - 1;
              }
            } while (local_fc != 2);
            paVar7 = paVar18;
            if (0 < (int)uVar11) {
              paVar29->mNumIndices = 3;
              if (paVar29->mIndices == (uint *)0x0) {
                puVar15 = (uint *)operator_new__(0xc);
                paVar29->mIndices = puVar15;
              }
              lVar28 = -1;
              pcVar22 = local_38;
              uVar31 = 1;
              do {
                uVar26 = uVar31;
                pcVar21 = pcVar22;
                lVar8 = lVar28 + 1;
                lVar28 = lVar28 + 1;
                pcVar22 = pcVar21 + 1;
                uVar31 = uVar26 + 1;
              } while (*(char *)((long)pvVar14 + lVar8) != '\0');
              *paVar29->mIndices = (uint)lVar28;
              do {
                pcVar22 = pcVar21;
                uVar31 = uVar26;
                uVar26 = uVar31 + 1;
                pcVar21 = pcVar22 + 1;
              } while (*(char *)((long)pvVar14 + uVar31) != '\0');
              paVar29->mIndices[1] = (int)(uVar31 + 1) - 1;
              do {
                uVar17 = (int)uVar31 + 1;
                uVar31 = (ulong)uVar17;
                cVar3 = *pcVar22;
                pcVar22 = pcVar22 + 1;
              } while (cVar3 != '\0');
              paVar29->mIndices[2] = uVar17;
              paVar29 = paVar29 + 1;
            }
            for (; paVar18 = paVar29, paVar7 != paVar18; paVar7 = paVar7 + 1) {
              puVar15 = paVar7->mIndices;
              *puVar15 = local_90[*puVar15];
              puVar15[1] = local_90[puVar15[1]];
              puVar15[2] = local_90[puVar15[2]];
              paVar29 = paVar18;
            }
            if (paVar13[uVar23].mIndices != (uint *)0x0) {
              operator_delete__(paVar13[uVar23].mIndices);
            }
            paVar13[uVar23].mIndices = (uint *)0x0;
            uVar23 = local_78;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < pMesh->mNumFaces);
    }
    paVar13 = pMesh->mFaces;
    if (paVar13 != (aiFace *)0x0) {
      puVar15 = paVar13[-1].mIndices;
      if (puVar15 != (uint *)0x0) {
        lVar28 = (long)puVar15 << 4;
        do {
          pvVar5 = *(void **)((long)&paVar13[-1].mIndices + lVar28);
          if (pvVar5 != (void *)0x0) {
            operator_delete__(pvVar5);
          }
          lVar28 = lVar28 + -0x10;
        } while (lVar28 != 0);
      }
      operator_delete__(&paVar13[-1].mIndices,(long)puVar15 << 4 | 8);
    }
    pMesh->mFaces = local_80;
    pMesh->mNumFaces = (uint)((ulong)((long)paVar18 - (long)local_80) >> 4);
    operator_delete__(pvVar14);
    if (local_68.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_50.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return true;
  }
  return false;
}

Assistant:

bool TriangulateProcess::TriangulateMesh( aiMesh* pMesh)
{
    // Now we have aiMesh::mPrimitiveTypes, so this is only here for test cases
    if (!pMesh->mPrimitiveTypes)    {
        bool bNeed = false;

        for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
            const aiFace& face = pMesh->mFaces[a];

            if( face.mNumIndices != 3)  {
                bNeed = true;
            }
        }
        if (!bNeed)
            return false;
    }
    else if (!(pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON)) {
        return false;
    }

    // Find out how many output faces we'll get
    unsigned int numOut = 0, max_out = 0;
    bool get_normals = true;
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices <= 4) {
            get_normals = false;
        }
        if( face.mNumIndices <= 3) {
            numOut++;

        }
        else {
            numOut += face.mNumIndices-2;
            max_out = std::max(max_out,face.mNumIndices);
        }
    }

    // Just another check whether aiMesh::mPrimitiveTypes is correct
    ai_assert(numOut != pMesh->mNumFaces);

    aiVector3D* nor_out = NULL;

    // if we don't have normals yet, but expect them to be a cheap side
    // product of triangulation anyway, allocate storage for them.
    if (!pMesh->mNormals && get_normals) {
        // XXX need a mechanism to inform the GenVertexNormals process to treat these normals as preprocessed per-face normals
    //  nor_out = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    }

    // the output mesh will contain triangles, but no polys anymore
    pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
    pMesh->mPrimitiveTypes &= ~aiPrimitiveType_POLYGON;

    aiFace* out = new aiFace[numOut](), *curOut = out;
    std::vector<aiVector3D> temp_verts3d(max_out+2); /* temporary storage for vertices */
    std::vector<aiVector2D> temp_verts(max_out+2);

    // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
    if (!pMesh->mColors[0])
        pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
    else
        new(pMesh->mColors[0]) aiColor4D[pMesh->mNumVertices];

    aiColor4D* clr = pMesh->mColors[0];
#endif

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    FILE* fout = fopen(POLY_OUTPUT_FILE,"a");
#endif

    const aiVector3D* verts = pMesh->mVertices;

    // use std::unique_ptr to avoid slow std::vector<bool> specialiations
    std::unique_ptr<bool[]> done(new bool[max_out]);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];

        unsigned int* idx = face.mIndices;
        int num = (int)face.mNumIndices, ear = 0, tmp, prev = num-1, next = 0, max = num;

        // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            aiColor4D& c = clr[idx[i]];
            c.r = (i+1) / (float)max;
            c.b = 1.f - c.r;
        }
#endif

        aiFace* const last_face = curOut;

        // if it's a simple point,line or triangle: just copy it
        if( face.mNumIndices <= 3)
        {
            aiFace& nface = *curOut++;
            nface.mNumIndices = face.mNumIndices;
            nface.mIndices    = face.mIndices;

            face.mIndices = NULL;
            continue;
        }
        // optimized code for quadrilaterals
        else if ( face.mNumIndices == 4) {

            // quads can have at maximum one concave vertex. Determine
            // this vertex (if it exists) and start tri-fanning from
            // it.
            unsigned int start_vertex = 0;
            for (unsigned int i = 0; i < 4; ++i) {
                const aiVector3D& v0 = verts[face.mIndices[(i+3) % 4]];
                const aiVector3D& v1 = verts[face.mIndices[(i+2) % 4]];
                const aiVector3D& v2 = verts[face.mIndices[(i+1) % 4]];

                const aiVector3D& v = verts[face.mIndices[i]];

                aiVector3D left = (v0-v);
                aiVector3D diag = (v1-v);
                aiVector3D right = (v2-v);

                left.Normalize();
                diag.Normalize();
                right.Normalize();

                const float angle = std::acos(left*diag) + std::acos(right*diag);
                if (angle > AI_MATH_PI_F) {
                    // this is the concave point
                    start_vertex = i;
                    break;
                }
            }

            const unsigned int temp[] = {face.mIndices[0], face.mIndices[1], face.mIndices[2], face.mIndices[3]};

            aiFace& nface = *curOut++;
            nface.mNumIndices = 3;
            nface.mIndices = face.mIndices;

            nface.mIndices[0] = temp[start_vertex];
            nface.mIndices[1] = temp[(start_vertex + 1) % 4];
            nface.mIndices[2] = temp[(start_vertex + 2) % 4];

            aiFace& sface = *curOut++;
            sface.mNumIndices = 3;
            sface.mIndices = new unsigned int[3];

            sface.mIndices[0] = temp[start_vertex];
            sface.mIndices[1] = temp[(start_vertex + 2) % 4];
            sface.mIndices[2] = temp[(start_vertex + 3) % 4];

            // prevent double deletion of the indices field
            face.mIndices = NULL;
            continue;
        }
        else
        {
            // A polygon with more than 3 vertices can be either concave or convex.
            // Usually everything we're getting is convex and we could easily
            // triangulate by tri-fanning. However, LightWave is probably the only
            // modeling suite to make extensive use of highly concave, monster polygons ...
            // so we need to apply the full 'ear cutting' algorithm to get it right.

            // RERQUIREMENT: polygon is expected to be simple and *nearly* planar.
            // We project it onto a plane to get a 2d triangle.

            // Collect all vertices of of the polygon.
           for (tmp = 0; tmp < max; ++tmp) {
                temp_verts3d[tmp] = verts[idx[tmp]];
            }

            // Get newell normal of the polygon. Store it for future use if it's a polygon-only mesh
            aiVector3D n;
            NewellNormal<3,3,3>(n,max,&temp_verts3d.front().x,&temp_verts3d.front().y,&temp_verts3d.front().z);
            if (nor_out) {
                 for (tmp = 0; tmp < max; ++tmp)
                     nor_out[idx[tmp]] = n;
            }

            // Select largest normal coordinate to ignore for projection
            const float ax = (n.x>0 ? n.x : -n.x);
            const float ay = (n.y>0 ? n.y : -n.y);
            const float az = (n.z>0 ? n.z : -n.z);

            unsigned int ac = 0, bc = 1; /* no z coord. projection to xy */
            float inv = n.z;
            if (ax > ay) {
                if (ax > az) { /* no x coord. projection to yz */
                    ac = 1; bc = 2;
                    inv = n.x;
                }
            }
            else if (ay > az) { /* no y coord. projection to zy */
                ac = 2; bc = 0;
                inv = n.y;
            }

            // Swap projection axes to take the negated projection vector into account
            if (inv < 0.f) {
                std::swap(ac,bc);
            }

            for (tmp =0; tmp < max; ++tmp) {
                temp_verts[tmp].x = verts[idx[tmp]][ac];
                temp_verts[tmp].y = verts[idx[tmp]][bc];
                done[tmp] = false;
            }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
            // plot the plane onto which we mapped the polygon to a 2D ASCII pic
            aiVector2D bmin,bmax;
            ArrayBounds(&temp_verts[0],max,bmin,bmax);

            char grid[POLY_GRID_Y][POLY_GRID_X+POLY_GRID_XPAD];
            std::fill_n((char*)grid,POLY_GRID_Y*(POLY_GRID_X+POLY_GRID_XPAD),' ');

            for (int i =0; i < max; ++i) {
                const aiVector2D& v = (temp_verts[i] - bmin) / (bmax-bmin);
                const size_t x = static_cast<size_t>(v.x*(POLY_GRID_X-1)), y = static_cast<size_t>(v.y*(POLY_GRID_Y-1));
                char* loc = grid[y]+x;
                if (grid[y][x] != ' ') {
                    for(;*loc != ' '; ++loc);
                    *loc++ = '_';
                }
                *(loc+::ai_snprintf(loc, POLY_GRID_XPAD,"%i",i)) = ' ';
            }


            for(size_t y = 0; y < POLY_GRID_Y; ++y) {
                grid[y][POLY_GRID_X+POLY_GRID_XPAD-1] = '\0';
                fprintf(fout,"%s\n",grid[y]);
            }

            fprintf(fout,"\ntriangulation sequence: ");
#endif

            //
            // FIXME: currently this is the slow O(kn) variant with a worst case
            // complexity of O(n^2) (I think). Can be done in O(n).
            while (num > 3) {

                // Find the next ear of the polygon
                int num_found = 0;
                for (ear = next;;prev = ear,ear = next) {

                    // break after we looped two times without a positive match
                    for (next=ear+1;done[(next>=max?next=0:next)];++next);
                    if (next < ear) {
                        if (++num_found == 2) {
                            break;
                        }
                    }
                    const aiVector2D* pnt1 = &temp_verts[ear],
                        *pnt0 = &temp_verts[prev],
                        *pnt2 = &temp_verts[next];

                    // Must be a convex point. Assuming ccw winding, it must be on the right of the line between p-1 and p+1.
                    if (OnLeftSideOfLine2D(*pnt0,*pnt2,*pnt1)) {
                        continue;
                    }

                    // and no other point may be contained in this triangle
                    for ( tmp = 0; tmp < max; ++tmp) {

                        // We need to compare the actual values because it's possible that multiple indexes in
                        // the polygon are referring to the same position. concave_polygon.obj is a sample
                        //
                        // FIXME: Use 'epsiloned' comparisons instead? Due to numeric inaccuracies in
                        // PointInTriangle() I'm guessing that it's actually possible to construct
                        // input data that would cause us to end up with no ears. The problem is,
                        // which epsilon? If we chose a too large value, we'd get wrong results
                        const aiVector2D& vtmp = temp_verts[tmp];
                        if ( vtmp != *pnt1 && vtmp != *pnt2 && vtmp != *pnt0 && PointInTriangle2D(*pnt0,*pnt1,*pnt2,vtmp)) {
                            break;
                        }
                    }
                    if (tmp != max) {
                        continue;
                    }

                    // this vertex is an ear
                    break;
                }
                if (num_found == 2) {

                    // Due to the 'two ear theorem', every simple polygon with more than three points must
                    // have 2 'ears'. Here's definitely something wrong ... but we don't give up yet.
                    //

                    // Instead we're continuing with the standard tri-fanning algorithm which we'd
                    // use if we had only convex polygons. That's life.
                    ASSIMP_LOG_ERROR("Failed to triangulate polygon (no ear found). Probably not a simple polygon?");

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
                    fprintf(fout,"critical error here, no ear found! ");
#endif
                    num = 0;
                    break;

                    curOut -= (max-num); /* undo all previous work */
                    for (tmp = 0; tmp < max-2; ++tmp) {
                        aiFace& nface = *curOut++;

                        nface.mNumIndices = 3;
                        if (!nface.mIndices)
                            nface.mIndices = new unsigned int[3];

                        nface.mIndices[0] = 0;
                        nface.mIndices[1] = tmp+1;
                        nface.mIndices[2] = tmp+2;

                    }
                    num = 0;
                    break;
                }

                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;

                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                // setup indices for the new triangle ...
                nface.mIndices[0] = prev;
                nface.mIndices[1] = ear;
                nface.mIndices[2] = next;

                // exclude the ear from most further processing
                done[ear] = true;
                --num;
            }
            if (num > 0) {
                // We have three indices forming the last 'ear' remaining. Collect them.
                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;
                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                for (tmp = 0; done[tmp]; ++tmp);
                nface.mIndices[0] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[1] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[2] = tmp;

            }
        }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS

        for(aiFace* f = last_face; f != curOut; ++f) {
            unsigned int* i = f->mIndices;
            fprintf(fout," (%i %i %i)",i[0],i[1],i[2]);
        }

        fprintf(fout,"\n*********************************************************************\n");
        fflush(fout);

#endif

        for(aiFace* f = last_face; f != curOut; ) {
            unsigned int* i = f->mIndices;

            //  drop dumb 0-area triangles - deactivated for now:
            //FindDegenerates post processing step can do the same thing
            //if (std::fabs(GetArea2D(temp_verts[i[0]],temp_verts[i[1]],temp_verts[i[2]])) < 1e-5f) {
            //    ASSIMP_LOG_DEBUG("Dropping triangle with area 0");
            //    --curOut;

            //    delete[] f->mIndices;
            //    f->mIndices = nullptr;

            //    for(aiFace* ff = f; ff != curOut; ++ff) {
            //        ff->mNumIndices = (ff+1)->mNumIndices;
            //        ff->mIndices = (ff+1)->mIndices;
            //        (ff+1)->mIndices = nullptr;
            //    }
            //    continue;
            //}

            i[0] = idx[i[0]];
            i[1] = idx[i[1]];
            i[2] = idx[i[2]];
            ++f;
        }

        delete[] face.mIndices;
        face.mIndices = NULL;
    }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    fclose(fout);
#endif

    // kill the old faces
    delete [] pMesh->mFaces;

    // ... and store the new ones
    pMesh->mFaces    = out;
    pMesh->mNumFaces = (unsigned int)(curOut-out); /* not necessarily equal to numOut */
    return true;
}